

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  long lVar1;
  Rep *pRVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  void **ppvVar10;
  
  sVar9 = (size_t)(this->method_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->method_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (sVar9 != 0) {
    lVar1 = sVar9 * 8;
    lVar8 = 0;
    do {
      sVar6 = MethodDescriptorProto::ByteSizeLong
                        (*(MethodDescriptorProto **)((long)ppvVar10 + lVar8));
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar1 - lVar8 != 0);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 3) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar3 = ((this->name_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar6 = ServiceOptions::ByteSizeLong(this->options_);
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar9;
    return sVar9;
  }
  sVar9 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar9,&this->_cached_size_);
  return sVar9;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1UL * this->_internal_method_size();
  for (const auto& msg : this->method_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}